

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.hpp
# Opt level: O2

void __thiscall OpenMD::EAM::~EAM(EAM *this)

{
  (this->super_MetallicInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction =
       (_func_int **)&PTR__EAM_002c1310;
  std::__cxx11::string::~string((string *)&this->name_);
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree(&(this->simTypes_)._M_t);
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::~vector(&this->MixingMap);
  std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::~vector(&this->EAMdata);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->EAMtids).super__Vector_base<int,_std::allocator<int>_>);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->EAMtypes)._M_t);
  return;
}

Assistant:

void setForceField(ForceField* ff) { forceField_ = ff; }